

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O1

void re2::RE2FloatingPointFullMatchTypes(void)

{
  _Alloc_hider _Var1;
  undefined4 uVar2;
  bool bVar3;
  float v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Arg *args [1];
  string zeros;
  Arg *args_4 [1];
  float local_220;
  undefined4 uStack_21c;
  string local_218;
  Arg local_1f8;
  Arg local_1e8;
  LogMessage local_1d8;
  undefined1 *local_58;
  long local_50;
  undefined1 local_48 [16];
  Arg *local_38;
  
  local_58 = local_48;
  std::__cxx11::string::_M_construct((ulong)&local_58,-0x18);
  RE2::RE2((RE2 *)&local_1d8,"(.*)");
  local_1f8.parser_ = RE2::Arg::parse_float;
  local_218._M_dataplus._M_p = "100";
  local_218._M_string_length._0_4_ = 3;
  local_1f8.arg_ = &local_220;
  local_1e8.arg_ = &local_1f8;
  bVar3 = RE2::FullMatchN((StringPiece *)&local_218,(RE2 *)&local_1d8,(Arg **)&local_1e8,1);
  RE2::~RE2((RE2 *)&local_1d8);
  if (!bVar3) {
    LogMessage::LogMessage
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x35e,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1d8.str_,"Check failed: RE2::FullMatch(\"100\", \"(.*)\", &v)",0x2f
              );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1d8);
  }
  if ((local_220 != 100.0) || (NAN(local_220))) {
    LogMessage::LogMessage
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x35e,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1d8.str_,"Check failed: (v) == (100)",0x1a);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1d8);
  }
  RE2::RE2((RE2 *)&local_1d8,"(.*)");
  local_1f8.parser_ = RE2::Arg::parse_float;
  local_218._M_dataplus._M_p = "-100.";
  local_218._M_string_length._0_4_ = 5;
  local_1f8.arg_ = &local_220;
  local_1e8.arg_ = &local_1f8;
  bVar3 = RE2::FullMatchN((StringPiece *)&local_218,(RE2 *)&local_1d8,(Arg **)&local_1e8,1);
  RE2::~RE2((RE2 *)&local_1d8);
  if (!bVar3) {
    LogMessage::LogMessage
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x35f,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1d8.str_,"Check failed: RE2::FullMatch(\"-100.\", \"(.*)\", &v)",
               0x31);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1d8);
  }
  if ((local_220 != -100.0) || (NAN(local_220))) {
    LogMessage::LogMessage
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x35f,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1d8.str_,"Check failed: (v) == (-100)",0x1b);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1d8);
  }
  RE2::RE2((RE2 *)&local_1d8,"(.*)");
  local_1f8.parser_ = RE2::Arg::parse_float;
  local_218._M_dataplus._M_p = "1e23";
  local_218._M_string_length._0_4_ = 4;
  local_1f8.arg_ = &local_220;
  local_1e8.arg_ = &local_1f8;
  bVar3 = RE2::FullMatchN((StringPiece *)&local_218,(RE2 *)&local_1d8,(Arg **)&local_1e8,1);
  RE2::~RE2((RE2 *)&local_1d8);
  if (!bVar3) {
    LogMessage::LogMessage
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x360,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1d8.str_,"Check failed: RE2::FullMatch(\"1e23\", \"(.*)\", &v)",
               0x30);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1d8);
  }
  if ((local_220 != 1e+23) || (NAN(local_220))) {
    LogMessage::LogMessage
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x360,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1d8.str_,"Check failed: (v) == (float(1e23))",0x22);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1d8);
  }
  RE2::RE2((RE2 *)&local_1d8,"(.*)");
  local_1f8.parser_ = RE2::Arg::parse_float;
  local_218._M_dataplus._M_p = " 100";
  local_218._M_string_length._0_4_ = 4;
  local_1f8.arg_ = &local_220;
  local_1e8.arg_ = &local_1f8;
  bVar3 = RE2::FullMatchN((StringPiece *)&local_218,(RE2 *)&local_1d8,(Arg **)&local_1e8,1);
  RE2::~RE2((RE2 *)&local_1d8);
  if (!bVar3) {
    LogMessage::LogMessage
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x361,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1d8.str_,"Check failed: RE2::FullMatch(\" 100\", \"(.*)\", &v)",
               0x30);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1d8);
  }
  if ((local_220 != 100.0) || (NAN(local_220))) {
    LogMessage::LogMessage
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x361,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1d8.str_,"Check failed: (v) == (100)",0x1a);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1d8);
  }
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_218,local_58,local_58 + local_50);
  std::__cxx11::string::append((char *)&local_218);
  uVar2 = (undefined4)local_218._M_string_length;
  _Var1._M_p = local_218._M_dataplus._M_p;
  RE2::RE2((RE2 *)&local_1d8,"(.*)");
  local_1e8.parser_ = RE2::Arg::parse_float;
  local_1f8.arg_ = _Var1._M_p;
  local_1f8.parser_ = (Parser)CONCAT44(local_1f8.parser_._4_4_,uVar2);
  local_1e8.arg_ = &local_220;
  local_38 = &local_1e8;
  bVar3 = RE2::FullMatchN((StringPiece *)&local_1f8,(RE2 *)&local_1d8,&local_38,1);
  RE2::~RE2((RE2 *)&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  if (!bVar3) {
    LogMessage::LogMessage
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x363,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1d8.str_,
               "Check failed: RE2::FullMatch(zeros + \"1e23\", \"(.*)\", &v)",0x38);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1d8);
  }
  if ((local_220 != 1e+23) || (NAN(local_220))) {
    LogMessage::LogMessage
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x364,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1d8.str_,"Check failed: (v) == (float(1e23))",0x22);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1d8);
  }
  RE2::RE2((RE2 *)&local_1d8,"(.*)");
  local_1f8.parser_ = RE2::Arg::parse_float;
  local_218._M_dataplus._M_p = "0.1";
  local_218._M_string_length._0_4_ = 3;
  local_1f8.arg_ = &local_220;
  local_1e8.arg_ = &local_1f8;
  bVar3 = RE2::FullMatchN((StringPiece *)&local_218,(RE2 *)&local_1d8,(Arg **)&local_1e8,1);
  RE2::~RE2((RE2 *)&local_1d8);
  if (!bVar3) {
    LogMessage::LogMessage
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x376,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1d8.str_,"Check failed: RE2::FullMatch(\"0.1\", \"(.*)\", &v)",0x2f
              );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1d8);
  }
  if ((local_220 != 0.1) || (NAN(local_220))) {
    LogMessage::LogMessage
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x377,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1d8.str_,"Check failed: (v) == (0.1f)",0x1b);
    StringPrintf_abi_cxx11_(&local_218,"%.8g != %.8g",(double)local_220,0x3fb99999a0000000);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1d8.str_,local_218._M_dataplus._M_p,
               CONCAT44(local_218._M_string_length._4_4_,(undefined4)local_218._M_string_length));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1d8);
  }
  RE2::RE2((RE2 *)&local_1d8,"(.*)");
  local_1f8.parser_ = RE2::Arg::parse_float;
  local_218._M_dataplus._M_p = "6700000000081920.1";
  local_218._M_string_length._0_4_ = 0x12;
  local_1f8.arg_ = &local_220;
  local_1e8.arg_ = &local_1f8;
  bVar3 = RE2::FullMatchN((StringPiece *)&local_218,(RE2 *)&local_1d8,(Arg **)&local_1e8,1);
  RE2::~RE2((RE2 *)&local_1d8);
  if (!bVar3) {
    LogMessage::LogMessage
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x378,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1d8.str_,
               "Check failed: RE2::FullMatch(\"6700000000081920.1\", \"(.*)\", &v)",0x3e);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1d8);
  }
  if ((local_220 != 6.7000003e+15) || (NAN(local_220))) {
    LogMessage::LogMessage
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x379,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1d8.str_,"Check failed: (v) == (6700000000081920.1f)",0x2a);
    StringPrintf_abi_cxx11_(&local_218,"%.8g != %.8g",(double)local_220,0x4337cd9d60000000);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1d8.str_,local_218._M_dataplus._M_p,
               CONCAT44(local_218._M_string_length._4_4_,(undefined4)local_218._M_string_length));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1d8);
  }
  RE2::RE2((RE2 *)&local_1d8,"(.*)");
  local_1f8.parser_ = RE2::Arg::parse_double;
  local_218._M_dataplus._M_p = "100";
  local_218._M_string_length._0_4_ = 3;
  local_1f8.arg_ = &local_220;
  local_1e8.arg_ = &local_1f8;
  bVar3 = RE2::FullMatchN((StringPiece *)&local_218,(RE2 *)&local_1d8,(Arg **)&local_1e8,1);
  RE2::~RE2((RE2 *)&local_1d8);
  if (!bVar3) {
    LogMessage::LogMessage
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x37f,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1d8.str_,"Check failed: RE2::FullMatch(\"100\", \"(.*)\", &v)",0x2f
              );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1d8);
  }
  if (((double)CONCAT44(uStack_21c,local_220) != 100.0) ||
     (NAN((double)CONCAT44(uStack_21c,local_220)))) {
    LogMessage::LogMessage
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x37f,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1d8.str_,"Check failed: (v) == (100)",0x1a);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1d8);
  }
  RE2::RE2((RE2 *)&local_1d8,"(.*)");
  local_1f8.parser_ = RE2::Arg::parse_double;
  local_218._M_dataplus._M_p = "-100.";
  local_218._M_string_length._0_4_ = 5;
  local_1f8.arg_ = &local_220;
  local_1e8.arg_ = &local_1f8;
  bVar3 = RE2::FullMatchN((StringPiece *)&local_218,(RE2 *)&local_1d8,(Arg **)&local_1e8,1);
  RE2::~RE2((RE2 *)&local_1d8);
  if (!bVar3) {
    LogMessage::LogMessage
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x380,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1d8.str_,"Check failed: RE2::FullMatch(\"-100.\", \"(.*)\", &v)",
               0x31);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1d8);
  }
  if (((double)CONCAT44(uStack_21c,local_220) != -100.0) ||
     (NAN((double)CONCAT44(uStack_21c,local_220)))) {
    LogMessage::LogMessage
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x380,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1d8.str_,"Check failed: (v) == (-100)",0x1b);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1d8);
  }
  RE2::RE2((RE2 *)&local_1d8,"(.*)");
  local_1f8.parser_ = RE2::Arg::parse_double;
  local_218._M_dataplus._M_p = "1e23";
  local_218._M_string_length._0_4_ = 4;
  local_1f8.arg_ = &local_220;
  local_1e8.arg_ = &local_1f8;
  bVar3 = RE2::FullMatchN((StringPiece *)&local_218,(RE2 *)&local_1d8,(Arg **)&local_1e8,1);
  RE2::~RE2((RE2 *)&local_1d8);
  if (!bVar3) {
    LogMessage::LogMessage
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x381,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1d8.str_,"Check failed: RE2::FullMatch(\"1e23\", \"(.*)\", &v)",
               0x30);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1d8);
  }
  if (((double)CONCAT44(uStack_21c,local_220) != 1e+23) ||
     (NAN((double)CONCAT44(uStack_21c,local_220)))) {
    LogMessage::LogMessage
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x381,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1d8.str_,"Check failed: (v) == (1e23)",0x1b);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1d8);
  }
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_218,local_58,local_58 + local_50);
  std::__cxx11::string::append((char *)&local_218);
  uVar2 = (undefined4)local_218._M_string_length;
  _Var1._M_p = local_218._M_dataplus._M_p;
  RE2::RE2((RE2 *)&local_1d8,"(.*)");
  local_1e8.parser_ = RE2::Arg::parse_double;
  local_1f8.arg_ = _Var1._M_p;
  local_1f8.parser_ = (Parser)CONCAT44(local_1f8.parser_._4_4_,uVar2);
  local_1e8.arg_ = &local_220;
  local_38 = &local_1e8;
  bVar3 = RE2::FullMatchN((StringPiece *)&local_1f8,(RE2 *)&local_1d8,&local_38,1);
  RE2::~RE2((RE2 *)&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  if (!bVar3) {
    LogMessage::LogMessage
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x382,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1d8.str_,
               "Check failed: RE2::FullMatch(zeros + \"1e23\", \"(.*)\", &v)",0x38);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1d8);
  }
  if (((double)CONCAT44(uStack_21c,local_220) != 1e+23) ||
     (NAN((double)CONCAT44(uStack_21c,local_220)))) {
    LogMessage::LogMessage
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,899,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1d8.str_,"Check failed: (v) == (double(1e23))",0x23);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1d8);
  }
  RE2::RE2((RE2 *)&local_1d8,"(.*)");
  local_1f8.parser_ = RE2::Arg::parse_double;
  local_218._M_dataplus._M_p = "0.1";
  local_218._M_string_length._0_4_ = 3;
  local_1f8.arg_ = &local_220;
  local_1e8.arg_ = &local_1f8;
  bVar3 = RE2::FullMatchN((StringPiece *)&local_218,(RE2 *)&local_1d8,(Arg **)&local_1e8,1);
  RE2::~RE2((RE2 *)&local_1d8);
  if (!bVar3) {
    LogMessage::LogMessage
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x385,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1d8.str_,"Check failed: RE2::FullMatch(\"0.1\", \"(.*)\", &v)",0x2f
              );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1d8);
  }
  if (((double)CONCAT44(uStack_21c,local_220) != 0.1) ||
     (NAN((double)CONCAT44(uStack_21c,local_220)))) {
    LogMessage::LogMessage
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x386,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1d8.str_,"Check failed: (v) == (0.1)",0x1a);
    StringPrintf_abi_cxx11_
              (&local_218,"%.17g != %.17g",CONCAT44(uStack_21c,local_220),0x3fb999999999999a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1d8.str_,local_218._M_dataplus._M_p,
               CONCAT44(local_218._M_string_length._4_4_,(undefined4)local_218._M_string_length));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1d8);
  }
  RE2::RE2((RE2 *)&local_1d8,"(.*)");
  local_1f8.parser_ = RE2::Arg::parse_double;
  local_218._M_dataplus._M_p = "1.00000005960464485";
  local_218._M_string_length._0_4_ = 0x13;
  local_1f8.arg_ = &local_220;
  local_1e8.arg_ = &local_1f8;
  bVar3 = RE2::FullMatchN((StringPiece *)&local_218,(RE2 *)&local_1d8,(Arg **)&local_1e8,1);
  RE2::~RE2((RE2 *)&local_1d8);
  if (!bVar3) {
    LogMessage::LogMessage
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x387,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1d8.str_,
               "Check failed: RE2::FullMatch(\"1.00000005960464485\", \"(.*)\", &v)",0x3f);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1d8);
  }
  if (((double)CONCAT44(uStack_21c,local_220) != 1.0000000596046448) ||
     (NAN((double)CONCAT44(uStack_21c,local_220)))) {
    LogMessage::LogMessage
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x388,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1d8.str_,"Check failed: (v) == (1.0000000596046448)",0x29);
    StringPrintf_abi_cxx11_
              (&local_218,"%.17g != %.17g",CONCAT44(uStack_21c,local_220),0x3ff0000010000000);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1d8.str_,local_218._M_dataplus._M_p,
               CONCAT44(local_218._M_string_length._4_4_,(undefined4)local_218._M_string_length));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1d8);
  }
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  return;
}

Assistant:

TEST(CheckRewriteString, all) {
  TestCheckRewriteString("abc", "foo", true);
  TestCheckRewriteString("abc", "foo\\", false);
  TestCheckRewriteString("abc", "foo\\0bar", true);

  TestCheckRewriteString("a(b)c", "foo", true);
  TestCheckRewriteString("a(b)c", "foo\\0bar", true);
  TestCheckRewriteString("a(b)c", "foo\\1bar", true);
  TestCheckRewriteString("a(b)c", "foo\\2bar", false);
  TestCheckRewriteString("a(b)c", "f\\\\2o\\1o", true);

  TestCheckRewriteString("a(b)(c)", "foo\\12", true);
  TestCheckRewriteString("a(b)(c)", "f\\2o\\1o", true);
  TestCheckRewriteString("a(b)(c)", "f\\oo\\1", false);
}